

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

size_type __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::erase(sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *this,key_type *key)

{
  bool bVar1;
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_RDI;
  const_iterator pos;
  const_iterator *in_stack_fffffffffffffeb8;
  const_iterator *in_stack_fffffffffffffec8;
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffed0;
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff60;
  ulong local_8;
  
  find<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hashtable_const_iterator(in_RDI,(iterator *)in_stack_fffffffffffffeb8);
  end(in_stack_ffffffffffffff50);
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hashtable_const_iterator(in_RDI,(iterator *)in_stack_fffffffffffffeb8);
  bVar1 = sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::operator!=(in_RDI,in_stack_fffffffffffffeb8);
  if (bVar1) {
    set_deleted(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    (in_RDI->end).row_begin._M_current =
         (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)((long)&((in_RDI->end).row_begin._M_current)->group + 1);
    sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
    set_consider_shrink((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)in_RDI,true)
    ;
  }
  local_8 = (ulong)bVar1;
  return local_8;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }